

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O0

void __thiscall
CheckedTimedMutexTest_TryLockForDeadlock_Test<yamc::checked::timed_mutex>::
CheckedTimedMutexTest_TryLockForDeadlock_Test
          (CheckedTimedMutexTest_TryLockForDeadlock_Test<yamc::checked::timed_mutex> *this)

{
  CheckedTimedMutexTest_TryLockForDeadlock_Test<yamc::checked::timed_mutex> *this_local;
  
  CheckedTimedMutexTest<yamc::checked::timed_mutex>::CheckedTimedMutexTest
            (&this->super_CheckedTimedMutexTest<yamc::checked::timed_mutex>);
  (this->super_CheckedTimedMutexTest<yamc::checked::timed_mutex>).super_Test._vptr_Test =
       (_func_int **)&PTR__CheckedTimedMutexTest_TryLockForDeadlock_Test_002ebb68;
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, TryLockForDeadlock)
{
  auto test_body = []{
    yamc::test::barrier step(2);
    TypeParam mtx1;
    TypeParam mtx2;
    yamc::test::task_runner(2, [&](std::size_t id) {
      switch (id) {
      case 0:
        ASSERT_TRUE(mtx1.try_lock_for(TEST_NOT_TIMEOUT));
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
        break;
      case 1:
        ASSERT_TRUE(mtx2.try_lock_for(TEST_NOT_TIMEOUT));
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx2.unlock());
        break;
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}